

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::BindContext::GetBinding
          (BindContext *this,BindingAlias *alias,string *column_name,ErrorData *out_error)

{
  Binding *pBVar1;
  iterator iVar2;
  reference pvVar3;
  BinderException *this_00;
  ErrorData *bindings;
  pointer prVar4;
  Binding *pBVar5;
  bool bVar6;
  vector<std::reference_wrapper<duckdb::Binding>,_true> matching_bindings;
  string helper_message;
  undefined1 local_128 [24];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  undefined1 *local_a8;
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  bindings = out_error;
  GetBindings((vector<std::reference_wrapper<duckdb::Binding>,_true> *)local_128,this,alias,
              out_error);
  if (local_128._0_8_ == local_128._8_8_) {
    pBVar5 = (Binding *)0x0;
  }
  else {
    pBVar5 = (Binding *)0x0;
    prVar4 = (pointer)local_128._0_8_;
    do {
      pBVar1 = prVar4->_M_data;
      iVar2 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pBVar1->name_map)._M_h,column_name);
      if ((iVar2.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur != (__node_type *)0x0) &&
         (bVar6 = pBVar5 != (Binding *)0x0, pBVar5 = pBVar1, bVar6)) {
        AmbiguityException_abi_cxx11_
                  ((string *)local_b0,(BindContext *)alias,(BindingAlias *)local_128,
                   (vector<std::reference_wrapper<duckdb::Binding>,_true> *)bindings);
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        local_110._M_dataplus._M_p = local_128 + 0x28;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_128 + 0x18),"Ambiguous reference to table \"%s\" %s","");
        BindingAlias::ToString_abi_cxx11_(&local_d0,alias);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,CONCAT62(local_b0._2_6_,local_b0._0_2_),
                   local_a8 + CONCAT62(local_b0._2_6_,local_b0._0_2_));
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (this_00,(string *)(local_128 + 0x18),&local_d0,&local_f0);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      prVar4 = prVar4 + 1;
    } while (prVar4 != (pointer)local_128._8_8_);
    if (pBVar5 == (Binding *)0x0) {
      pvVar3 = vector<std::reference_wrapper<duckdb::Binding>,_true>::operator[]
                         ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)local_128,0);
      (*pvVar3->_M_data->_vptr_Binding[2])(local_b0,pvVar3->_M_data,column_name);
      out_error->initialized = (bool)local_b0[0];
      out_error->type = local_b0[1];
      ::std::__cxx11::string::operator=((string *)&out_error->raw_message,(string *)&local_a8);
      ::std::__cxx11::string::operator=((string *)&out_error->final_message,(string *)local_88);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&out_error->extra_info,local_68);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_68);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
    }
  }
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_128._0_8_);
  }
  return (optional_ptr<duckdb::Binding,_true>)pBVar5;
}

Assistant:

optional_ptr<Binding> BindContext::GetBinding(const BindingAlias &alias, const string &column_name,
                                              ErrorData &out_error) {
	auto matching_bindings = GetBindings(alias, out_error);
	if (matching_bindings.empty()) {
		// no bindings found
		return nullptr;
	}

	optional_ptr<Binding> result;
	// find the binding that this column name belongs to
	for (auto &binding_ref : matching_bindings) {
		auto &binding = binding_ref.get();
		if (!binding.HasMatchingBinding(column_name)) {
			continue;
		}
		if (result) {
			// we found multiple bindings that this column name belongs to - ambiguity
			string helper_message = AmbiguityException(alias, matching_bindings);
			throw BinderException("Ambiguous reference to table \"%s\" %s", alias.ToString(), helper_message);
		} else {
			result = &binding;
		}
	}
	if (!result) {
		// found the table binding - but could not find the column
		out_error = matching_bindings[0].get().ColumnNotFoundError(column_name);
	}
	return result;
}